

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O1

void __thiscall
FIX::HttpConnection::processRoot
          (HttpConnection *this,HttpMessage *request,stringstream *h,stringstream *b)

{
  int64_t *piVar1;
  undefined *puVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  TABLE *pTVar6;
  ostream *poVar7;
  size_t sVar8;
  A *pAVar9;
  TD *pTVar10;
  Session *pSVar11;
  long *plVar12;
  ulong uVar13;
  _Rb_tree_node_base *p_Var14;
  long *plVar15;
  _func_int **pp_Var16;
  size_type *psVar17;
  char *pcVar18;
  char *pcVar19;
  ostream *stream;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  string href;
  HR hr;
  EM em;
  CAPTION caption;
  TABLE table;
  UtcTimeStamp local_7d8;
  long lStack_7c0;
  undefined1 local_7b8 [48];
  string local_788;
  ostream *local_768;
  long *local_760;
  long local_758;
  long local_750;
  long lStack_748;
  undefined1 local_740 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_728 [25];
  ostream *local_590;
  int64_t *local_588;
  undefined **local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  undefined1 local_558 [432];
  ostream *local_3a8;
  TAG local_3a0;
  TAG local_1e8;
  
  stream = (ostream *)(b + 0x10);
  HTML::TABLE::TABLE((TABLE *)&local_1e8,stream);
  pTVar6 = HTML::TABLE::border((TABLE *)&local_1e8,1);
  pTVar6 = HTML::TABLE::cellspacing(pTVar6,2);
  pTVar6 = HTML::TABLE::width(pTVar6,100);
  std::__ostream_insert<char,std::char_traits<char>>((pTVar6->super_TAG).m_stream,">",1);
  HTML::CAPTION::CAPTION((CAPTION *)&local_3a0,stream);
  std::__ostream_insert<char,std::char_traits<char>>(local_3a0.m_stream,">",1);
  HTML::EM::EM((EM *)local_558,stream);
  std::__ostream_insert<char,std::char_traits<char>>(local_3a8,">",1);
  Session::numSessions();
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," Sessions managed by QuickFIX",0x1d);
  HTML::HR::HR((HR *)local_740,stream);
  std::__ostream_insert<char,std::char_traits<char>>(local_590,">",1);
  HTML::TAG::~TAG((TAG *)local_740);
  puVar2 = HTML::NBSP;
  iVar5 = (int)stream;
  if (HTML::NBSP == (undefined *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + iVar5);
  }
  else {
    sVar8 = strlen(HTML::NBSP);
    std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar8);
  }
  HTML::A::A((A *)local_740,stream);
  HttpMessage::getParameterString_abi_cxx11_(&local_788,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7b8,
                 "/resetSessions",&local_788);
  pAVar9 = HTML::A::href((A *)local_740,(string *)local_7b8);
  piVar1 = &local_7d8.super_DateTime.m_time;
  local_7d8.super_DateTime._vptr_DateTime = (_func_int **)piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"RESET","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pAVar9->super_TAG).field_0x38,
             (char *)local_7d8.super_DateTime._vptr_DateTime,local_7d8.super_DateTime._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>((pAVar9->super_TAG).m_stream,">",1);
  if (local_7d8.super_DateTime._vptr_DateTime != (_func_int **)piVar1) {
    operator_delete(local_7d8.super_DateTime._vptr_DateTime,local_7d8.super_DateTime.m_time + 1);
  }
  pcVar18 = local_7b8 + 0x10;
  if ((char *)local_7b8._0_8_ != pcVar18) {
    operator_delete((void *)local_7b8._0_8_,local_7b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG((TAG *)local_740);
  puVar2 = HTML::NBSP;
  if (HTML::NBSP == (undefined *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + iVar5);
  }
  else {
    sVar8 = strlen(HTML::NBSP);
    std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar8);
  }
  HTML::A::A((A *)local_740,stream);
  HttpMessage::getParameterString_abi_cxx11_(&local_788,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7b8,
                 "/refreshSessions",&local_788);
  pAVar9 = HTML::A::href((A *)local_740,(string *)local_7b8);
  local_7d8.super_DateTime._vptr_DateTime = (_func_int **)piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"REFRESH","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pAVar9->super_TAG).field_0x38,
             (char *)local_7d8.super_DateTime._vptr_DateTime,local_7d8.super_DateTime._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>((pAVar9->super_TAG).m_stream,">",1);
  if (local_7d8.super_DateTime._vptr_DateTime != (_func_int **)piVar1) {
    operator_delete(local_7d8.super_DateTime._vptr_DateTime,local_7d8.super_DateTime.m_time + 1);
  }
  if ((char *)local_7b8._0_8_ != pcVar18) {
    operator_delete((void *)local_7b8._0_8_,local_7b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG((TAG *)local_740);
  puVar2 = HTML::NBSP;
  if (HTML::NBSP == (undefined *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + iVar5);
  }
  else {
    sVar8 = strlen(HTML::NBSP);
    std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar8);
  }
  HTML::A::A((A *)local_740,stream);
  HttpMessage::getParameterString_abi_cxx11_(&local_788,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7b8,
                 "/enableSessions",&local_788);
  pAVar9 = HTML::A::href((A *)local_740,(string *)local_7b8);
  local_7d8.super_DateTime._vptr_DateTime = (_func_int **)piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"ENABLE","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pAVar9->super_TAG).field_0x38,
             (char *)local_7d8.super_DateTime._vptr_DateTime,local_7d8.super_DateTime._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>((pAVar9->super_TAG).m_stream,">",1);
  if (local_7d8.super_DateTime._vptr_DateTime != (_func_int **)piVar1) {
    operator_delete(local_7d8.super_DateTime._vptr_DateTime,local_7d8.super_DateTime.m_time + 1);
  }
  if ((char *)local_7b8._0_8_ != pcVar18) {
    operator_delete((void *)local_7b8._0_8_,local_7b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG((TAG *)local_740);
  puVar2 = HTML::NBSP;
  if (HTML::NBSP == (undefined *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + iVar5);
  }
  else {
    sVar8 = strlen(HTML::NBSP);
    std::__ostream_insert<char,std::char_traits<char>>(stream,puVar2,sVar8);
  }
  HTML::A::A((A *)local_740,stream);
  HttpMessage::getParameterString_abi_cxx11_(&local_788,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7b8,
                 "/disableSessions",&local_788);
  pAVar9 = HTML::A::href((A *)local_740,(string *)local_7b8);
  local_7d8.super_DateTime._vptr_DateTime = (_func_int **)piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"DISABLE","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pAVar9->super_TAG).field_0x38,
             (char *)local_7d8.super_DateTime._vptr_DateTime,local_7d8.super_DateTime._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>((pAVar9->super_TAG).m_stream,">",1);
  if (local_7d8.super_DateTime._vptr_DateTime != (_func_int **)piVar1) {
    operator_delete(local_7d8.super_DateTime._vptr_DateTime,local_7d8.super_DateTime.m_time + 1);
  }
  if ((char *)local_7b8._0_8_ != pcVar18) {
    operator_delete((void *)local_7b8._0_8_,local_7b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG((TAG *)local_740);
  HTML::TAG::~TAG((TAG *)local_558);
  HTML::TAG::~TAG(&local_3a0);
  HTML::TR::TR((TR *)&local_3a0,stream);
  std::__ostream_insert<char,std::char_traits<char>>(local_3a0.m_stream,">",1);
  HTML::TD::TD((TD *)local_558,stream);
  pp_Var16 = (_func_int **)(local_740 + 0x10);
  local_740._0_8_ = pp_Var16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_740,"center","");
  pTVar10 = HTML::TD::align((TD *)local_558,(string *)local_740);
  local_7b8._0_8_ = pcVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7b8,"Session","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pTVar10->super_TAG).field_0x38,(char *)local_7b8._0_8_,local_7b8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>((pTVar10->super_TAG).m_stream,">",1);
  if ((char *)local_7b8._0_8_ != pcVar18) {
    operator_delete((void *)local_7b8._0_8_,local_7b8._16_8_ + 1);
  }
  if ((_func_int **)local_740._0_8_ != pp_Var16) {
    operator_delete((void *)local_740._0_8_,(ulong)(local_740._16_8_ + 1));
  }
  HTML::TAG::~TAG((TAG *)local_558);
  HTML::TD::TD((TD *)local_558,stream);
  local_740._0_8_ = pp_Var16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_740,"center","");
  pTVar10 = HTML::TD::align((TD *)local_558,(string *)local_740);
  local_7b8._0_8_ = pcVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7b8,"ConnectionType","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pTVar10->super_TAG).field_0x38,(char *)local_7b8._0_8_,local_7b8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>((pTVar10->super_TAG).m_stream,">",1);
  if ((char *)local_7b8._0_8_ != pcVar18) {
    operator_delete((void *)local_7b8._0_8_,local_7b8._16_8_ + 1);
  }
  if ((_func_int **)local_740._0_8_ != pp_Var16) {
    operator_delete((void *)local_740._0_8_,(ulong)(local_740._16_8_ + 1));
  }
  HTML::TAG::~TAG((TAG *)local_558);
  HTML::TD::TD((TD *)local_558,stream);
  local_740._0_8_ = pp_Var16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_740,"center","");
  pTVar10 = HTML::TD::align((TD *)local_558,(string *)local_740);
  local_7b8._0_8_ = pcVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7b8,"Enabled","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pTVar10->super_TAG).field_0x38,(char *)local_7b8._0_8_,local_7b8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>((pTVar10->super_TAG).m_stream,">",1);
  if ((char *)local_7b8._0_8_ != pcVar18) {
    operator_delete((void *)local_7b8._0_8_,local_7b8._16_8_ + 1);
  }
  if ((_func_int **)local_740._0_8_ != pp_Var16) {
    operator_delete((void *)local_740._0_8_,(ulong)(local_740._16_8_ + 1));
  }
  HTML::TAG::~TAG((TAG *)local_558);
  HTML::TD::TD((TD *)local_558,stream);
  local_740._0_8_ = pp_Var16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_740,"center","");
  pTVar10 = HTML::TD::align((TD *)local_558,(string *)local_740);
  local_7b8._0_8_ = pcVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7b8,"Session Time","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pTVar10->super_TAG).field_0x38,(char *)local_7b8._0_8_,local_7b8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>((pTVar10->super_TAG).m_stream,">",1);
  if ((char *)local_7b8._0_8_ != pcVar18) {
    operator_delete((void *)local_7b8._0_8_,local_7b8._16_8_ + 1);
  }
  if ((_func_int **)local_740._0_8_ != pp_Var16) {
    operator_delete((void *)local_740._0_8_,(ulong)(local_740._16_8_ + 1));
  }
  HTML::TAG::~TAG((TAG *)local_558);
  HTML::TD::TD((TD *)local_558,stream);
  local_740._0_8_ = pp_Var16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_740,"center","");
  pTVar10 = HTML::TD::align((TD *)local_558,(string *)local_740);
  local_7b8._0_8_ = pcVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7b8,"Logged On","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pTVar10->super_TAG).field_0x38,(char *)local_7b8._0_8_,local_7b8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>((pTVar10->super_TAG).m_stream,">",1);
  if ((char *)local_7b8._0_8_ != pcVar18) {
    operator_delete((void *)local_7b8._0_8_,local_7b8._16_8_ + 1);
  }
  if ((_func_int **)local_740._0_8_ != pp_Var16) {
    operator_delete((void *)local_740._0_8_,(ulong)(local_740._16_8_ + 1));
  }
  HTML::TAG::~TAG((TAG *)local_558);
  HTML::TD::TD((TD *)local_558,stream);
  local_740._0_8_ = pp_Var16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_740,"center","");
  pTVar10 = HTML::TD::align((TD *)local_558,(string *)local_740);
  local_7b8._0_8_ = pcVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7b8,"Next Incoming","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pTVar10->super_TAG).field_0x38,(char *)local_7b8._0_8_,local_7b8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>((pTVar10->super_TAG).m_stream,">",1);
  if ((char *)local_7b8._0_8_ != pcVar18) {
    operator_delete((void *)local_7b8._0_8_,local_7b8._16_8_ + 1);
  }
  if ((_func_int **)local_740._0_8_ != pp_Var16) {
    operator_delete((void *)local_740._0_8_,(ulong)(local_740._16_8_ + 1));
  }
  HTML::TAG::~TAG((TAG *)local_558);
  HTML::TD::TD((TD *)local_558,stream);
  local_740._0_8_ = pp_Var16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_740,"center","");
  pTVar10 = HTML::TD::align((TD *)local_558,(string *)local_740);
  local_7b8._0_8_ = pcVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7b8,"Next Outgoing","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pTVar10->super_TAG).field_0x38,(char *)local_7b8._0_8_,local_7b8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>((pTVar10->super_TAG).m_stream,">",1);
  if ((char *)local_7b8._0_8_ != pcVar18) {
    operator_delete((void *)local_7b8._0_8_,local_7b8._16_8_ + 1);
  }
  if ((_func_int **)local_740._0_8_ != pp_Var16) {
    operator_delete((void *)local_740._0_8_,(ulong)(local_740._16_8_ + 1));
  }
  local_768 = stream;
  HTML::TAG::~TAG((TAG *)local_558);
  HTML::TAG::~TAG(&local_3a0);
  Session::getSessions();
  if ((_Rb_tree_node_base *)local_7b8._24_8_ != (_Rb_tree_node_base *)(local_7b8 + 8)) {
    local_580 = &PTR__DateTime_001ed778;
    local_588 = (int64_t *)&PTR__DateTime_001ed798;
    pcVar18 = "yes";
    p_Var14 = (_Rb_tree_node_base *)local_7b8._24_8_;
    do {
      pSVar11 = Session::lookupSession((SessionID *)(p_Var14 + 1));
      if (pSVar11 != (Session *)0x0) {
        HTML::TR::TR((TR *)&local_3a0,local_768);
        std::__ostream_insert<char,std::char_traits<char>>(local_3a0.m_stream,">",1);
        HTML::TD::TD((TD *)local_558,local_768);
        std::__ostream_insert<char,std::char_traits<char>>(local_3a8,">",1);
        std::operator+(&local_578,"/session?BeginString=",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &p_Var14[1]._M_left);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_578);
        local_760 = &local_750;
        plVar15 = plVar12 + 2;
        if ((long *)*plVar12 == plVar15) {
          local_750 = *plVar15;
          lStack_748 = plVar12[3];
        }
        else {
          local_750 = *plVar15;
          local_760 = (long *)*plVar12;
        }
        local_758 = plVar12[1];
        *plVar12 = (long)plVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_760,(ulong)p_Var14[4]._M_left);
        local_7d8.super_DateTime._vptr_DateTime = (_func_int **)&local_7d8.super_DateTime.m_time;
        plVar15 = plVar12 + 2;
        if ((int64_t *)*plVar12 == plVar15) {
          local_7d8.super_DateTime.m_time = *plVar15;
          lStack_7c0 = plVar12[3];
        }
        else {
          local_7d8.super_DateTime.m_time = *plVar15;
          local_7d8.super_DateTime._vptr_DateTime = (_func_int **)*plVar12;
        }
        local_7d8.super_DateTime._8_8_ = plVar12[1];
        *plVar12 = (long)plVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_7d8);
        local_740._0_8_ = local_740 + 0x10;
        pp_Var16 = (_func_int **)(plVar12 + 2);
        if ((_func_int **)*plVar12 == pp_Var16) {
          local_740._16_8_ = *pp_Var16;
          aaStack_728[0]._0_8_ = plVar12[3];
        }
        else {
          local_740._16_8_ = *pp_Var16;
          local_740._0_8_ = (_func_int **)*plVar12;
        }
        local_740._8_8_ = plVar12[1];
        *plVar12 = (long)pp_Var16;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::_M_append(local_740,(ulong)p_Var14[7]._M_left);
        local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
        psVar17 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_788.field_2._M_allocated_capacity = *psVar17;
          local_788.field_2._8_8_ = plVar12[3];
        }
        else {
          local_788.field_2._M_allocated_capacity = *psVar17;
          local_788._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_788._M_string_length = plVar12[1];
        *plVar12 = (long)psVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if ((undefined1 *)local_740._0_8_ != local_740 + 0x10) {
          operator_delete((void *)local_740._0_8_,(ulong)(local_740._16_8_ + 1));
        }
        if (local_7d8.super_DateTime._vptr_DateTime !=
            (_func_int **)&local_7d8.super_DateTime.m_time) {
          operator_delete(local_7d8.super_DateTime._vptr_DateTime,
                          local_7d8.super_DateTime.m_time + 1);
        }
        if (local_760 != &local_750) {
          operator_delete(local_760,local_750 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        if (p_Var14[10]._M_parent != (_Base_ptr)0x0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_740,"&SessionQualifier=",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var14 + 10));
          std::__cxx11::string::_M_append((char *)&local_788,local_740._0_8_);
          if ((undefined1 *)local_740._0_8_ != local_740 + 0x10) {
            operator_delete((void *)local_740._0_8_,(ulong)(local_740._16_8_ + 1));
          }
        }
        HTML::A::A((A *)local_740,local_768);
        pAVar9 = HTML::A::href((A *)local_740,&local_788);
        local_7d8.super_DateTime._vptr_DateTime = (_func_int **)&local_7d8.super_DateTime.m_time;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7d8,p_Var14[0xb]._M_parent,
                   (long)&(p_Var14[0xb]._M_parent)->_M_color +
                   (long)&(p_Var14[0xb]._M_left)->_M_color);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(pAVar9->super_TAG).field_0x38,
                   (char *)local_7d8.super_DateTime._vptr_DateTime,local_7d8.super_DateTime._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((pAVar9->super_TAG).m_stream,">",1);
        if (local_7d8.super_DateTime._vptr_DateTime !=
            (_func_int **)&local_7d8.super_DateTime.m_time) {
          operator_delete(local_7d8.super_DateTime._vptr_DateTime,
                          local_7d8.super_DateTime.m_time + 1);
        }
        HTML::TAG::~TAG((TAG *)local_740);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p != &local_788.field_2) {
          operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
        }
        HTML::TAG::~TAG((TAG *)local_558);
        HTML::TD::TD((TD *)local_558,local_768);
        uVar13 = (ulong)(pSVar11->m_state).m_initiate;
        pcVar19 = "No sessions defined for acceptor";
        if (uVar13 != 0) {
          pcVar19 = "No sessions defined for initiator";
        }
        local_740._0_8_ = local_740 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_740,pcVar19 + 0x18,pcVar19 + 0x18 + uVar13 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_558 + 0x38),(char *)local_740._0_8_,local_740._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(local_3a8,">",1);
        if ((undefined1 *)local_740._0_8_ != local_740 + 0x10) {
          operator_delete((void *)local_740._0_8_,(ulong)(local_740._16_8_ + 1));
        }
        HTML::TAG::~TAG((TAG *)local_558);
        HTML::TD::TD((TD *)local_558,local_768);
        uVar13 = (ulong)(pSVar11->m_state).m_enabled;
        pcVar19 = "no";
        if (uVar13 != 0) {
          pcVar19 = pcVar18;
        }
        local_740._0_8_ = local_740 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_740,pcVar19,pcVar19 + uVar13 + 2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_558 + 0x38),(char *)local_740._0_8_,local_740._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(local_3a8,">",1);
        if ((undefined1 *)local_740._0_8_ != local_740 + 0x10) {
          operator_delete((void *)local_740._0_8_,(ulong)(local_740._16_8_ + 1));
        }
        HTML::TAG::~TAG((TAG *)local_558);
        HTML::TD::TD((TD *)local_558,local_768);
        DateTime::nowUtc();
        local_7d8.super_DateTime._8_8_ = local_788._M_string_length;
        local_7d8.super_DateTime.m_time = local_788.field_2._M_allocated_capacity;
        local_7d8.super_DateTime._vptr_DateTime = (_func_int **)local_588;
        bVar3 = TimeRange::isInRange(&pSVar11->m_sessionTime,&local_7d8);
        pcVar19 = "no";
        if (bVar3) {
          pcVar19 = pcVar18;
        }
        local_740._0_8_ = local_740 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_740,pcVar19,pcVar19 + (ulong)bVar3 + 2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_558 + 0x38),(char *)local_740._0_8_,local_740._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(local_3a8,">",1);
        if ((undefined1 *)local_740._0_8_ != local_740 + 0x10) {
          operator_delete((void *)local_740._0_8_,(ulong)(local_740._16_8_ + 1));
        }
        HTML::TAG::~TAG((TAG *)local_558);
        HTML::TD::TD((TD *)local_558,local_768);
        bVar4 = (pSVar11->m_state).m_sentLogon & (pSVar11->m_state).m_receivedLogon;
        pcVar19 = "no";
        if (bVar4 != 0) {
          pcVar19 = pcVar18;
        }
        local_740._0_8_ = local_740 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_740,pcVar19,pcVar19 + (ulong)bVar4 + 2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_558 + 0x38),(char *)local_740._0_8_,local_740._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(local_3a8,">",1);
        if ((undefined1 *)local_740._0_8_ != local_740 + 0x10) {
          operator_delete((void *)local_740._0_8_,(ulong)(local_740._16_8_ + 1));
        }
        HTML::TAG::~TAG((TAG *)local_558);
        HTML::TD::TD((TD *)local_558,local_768);
        iVar5 = SessionState::getNextTargetMsgSeqNum(&pSVar11->m_state);
        std::ostream::operator<<((ostream *)(local_558 + 0x38),iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(local_3a8,">",1);
        HTML::TAG::~TAG((TAG *)local_558);
        HTML::TD::TD((TD *)local_558,local_768);
        iVar5 = SessionState::getNextSenderMsgSeqNum(&pSVar11->m_state);
        std::ostream::operator<<((ostream *)(local_558 + 0x38),iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(local_3a8,">",1);
        HTML::TAG::~TAG((TAG *)local_558);
        HTML::TAG::~TAG(&local_3a0);
      }
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != (_Rb_tree_node_base *)(local_7b8 + 8));
  }
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree((_Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
               *)local_7b8);
  HTML::TAG::~TAG(&local_1e8);
  return;
}

Assistant:

void HttpConnection::processRoot
( const HttpMessage& request, std::stringstream& h, std::stringstream& b )
{
  TABLE table(b); table.border(1).cellspacing(2).width(100).text();

  { CAPTION caption(b); caption.text();
    EM em(b); em.text();
    b << Session::numSessions() << " Sessions managed by QuickFIX";
    { HR hr(b); hr.text(); }
    { b << NBSP; A a(b); a.href("/resetSessions" + request.getParameterString()).text("RESET"); }
    { b << NBSP; A a(b); a.href("/refreshSessions" + request.getParameterString()).text("REFRESH"); }
    { b << NBSP; A a(b); a.href("/enableSessions" + request.getParameterString()).text("ENABLE"); }
    { b << NBSP; A a(b); a.href("/disableSessions" + request.getParameterString()).text("DISABLE"); }
  }

  { TR tr(b); tr.text();
    { TD td(b); td.align("center").text("Session"); }
    { TD td(b); td.align("center").text("ConnectionType"); }
    { TD td(b); td.align("center").text("Enabled"); }
    { TD td(b); td.align("center").text("Session Time"); }
    { TD td(b); td.align("center").text("Logged On"); }
    { TD td(b); td.align("center").text("Next Incoming"); }
    { TD td(b); td.align("center").text("Next Outgoing"); }
  }

  std::set<SessionID> sessions = Session::getSessions();
  std::set<SessionID>::iterator i;
  for( i = sessions.begin(); i != sessions.end(); ++i )
  {
    Session* pSession = Session::lookupSession( *i );
    if( !pSession ) continue;

    { TR tr(b); tr.text();
      { TD td(b); td.text();
        std::string href = "/session?BeginString=" + i->getBeginString().getValue() +
                            "&SenderCompID=" + i->getSenderCompID().getValue() +
                            "&TargetCompID=" + i->getTargetCompID().getValue();
        if( i->getSessionQualifier().size() )
          href += "&SessionQualifier=" + i->getSessionQualifier();

        A a(b); a.href(href).text(i->toString());
      }
      { TD td(b); td.text(pSession->isInitiator() ? "initiator" : "acceptor"); }
      { TD td(b); td.text(pSession->isEnabled() ? "yes" : "no"); }
      { TD td(b); td.text(pSession->isSessionTime(UtcTimeStamp()) ? "yes" : "no"); }
      { TD td(b); td.text(pSession->isLoggedOn() ? "yes" : "no"); }
      { TD td(b); td.text(pSession->getExpectedTargetNum()); }
      { TD td(b); td.text(pSession->getExpectedSenderNum()); }
    }
  }
}